

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

Value * __thiscall
soul::heart::Parser::parseAnnotationValue(Value *__return_storage_ptr__,Parser *this)

{
  double dVar1;
  char *pcVar2;
  int64_t iVar3;
  ProgramImpl *pPVar4;
  bool bVar5;
  int iVar6;
  Handle h;
  CompileMessage local_d0;
  Value local_98;
  CompileMessage local_58;
  
  pcVar2 = (this->
           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           ).currentType.text;
  if ((pcVar2 == "$integer32") ||
     ((pcVar2 != (char *)0x0 && (iVar6 = strcmp(pcVar2,"$integer32"), iVar6 == 0)))) {
    iVar3 = (this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ).literalIntValue;
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    soul::Value::Value(__return_storage_ptr__,(int32_t)iVar3);
    return __return_storage_ptr__;
  }
  if ((pcVar2 == "$integer64") ||
     ((pcVar2 != (char *)0x0 && (iVar6 = strcmp(pcVar2,"$integer64"), iVar6 == 0)))) {
    iVar3 = (this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ).literalIntValue;
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    soul::Value::Value(__return_storage_ptr__,iVar3);
    return __return_storage_ptr__;
  }
  if ((pcVar2 == "$float32") ||
     ((pcVar2 != (char *)0x0 && (iVar6 = strcmp(pcVar2,"$float32"), iVar6 == 0)))) {
    dVar1 = (this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ).literalDoubleValue;
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    soul::Value::Value(__return_storage_ptr__,(float)dVar1);
    return __return_storage_ptr__;
  }
  if ((pcVar2 != "$float64") &&
     ((pcVar2 == (char *)0x0 || (iVar6 = strcmp(pcVar2,"$float64"), iVar6 != 0)))) {
    if ((pcVar2 == "$string literal") ||
       ((pcVar2 != (char *)0x0 && (iVar6 = strcmp(pcVar2,"$string literal"), iVar6 == 0)))) {
      pPVar4 = (this->program).pimpl;
      h.handle = (*(pPVar4->stringDictionary).super_StringDictionary._vptr_StringDictionary[2])
                           (&pPVar4->stringDictionary,
                            (this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                            ).currentStringValue._M_string_length,
                            (this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                            ).currentStringValue._M_dataplus._M_p);
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      skip(&this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          );
      soul::Value::createStringLiteral(__return_storage_ptr__,h);
    }
    else {
      bVar5 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matches(&this->
                         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                        ,"true");
      if (bVar5) {
        Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        ::skip(&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              );
        bVar5 = true;
      }
      else {
        bVar5 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matches(&this->
                           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                          ,"false");
        if (!bVar5) {
          bVar5 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  ::matchIf<soul::TokenType>
                            (&this->
                              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                             ,(TokenType)0x28452c);
          if (bVar5) {
            parseAnnotationValue(&local_98,this);
            negate(__return_storage_ptr__,this,&local_98);
            soul::Value::~Value(&local_98);
            return __return_storage_ptr__;
          }
          pcVar2 = (this->
                   super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                   ).currentType.text;
          if ((pcVar2 != "$variableIdentifier") &&
             ((pcVar2 == (char *)0x0 || (iVar6 = strcmp(pcVar2,"$variableIdentifier"), iVar6 != 0)))
             ) {
            parseNaNandInfinityTokens(__return_storage_ptr__,this);
            if ((__return_storage_ptr__->type).category != invalid) {
              return __return_storage_ptr__;
            }
            CompileMessageHelpers::createMessage<>
                      (&local_d0,syntax,error,"Missing annotation value");
            CodeLocation::throwError
                      (&(this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                        ).location,&local_d0);
          }
          CompileMessageHelpers::createMessage<>
                    (&local_58,syntax,error,"Property values must be compile-time constants");
          CodeLocation::throwError
                    (&(this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      ).location,&local_58);
        }
        Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        ::skip(&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              );
        bVar5 = false;
      }
      soul::Value::Value(__return_storage_ptr__,bVar5);
    }
    return __return_storage_ptr__;
  }
  dVar1 = (this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ).literalDoubleValue;
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::skip
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            );
  soul::Value::Value(__return_storage_ptr__,dVar1);
  return __return_storage_ptr__;
}

Assistant:

Value parseAnnotationValue()
    {
        if (matches (Token::literalInt32))       { auto v = literalIntValue;    skip(); return Value::createInt32 (v); }
        if (matches (Token::literalInt64))       { auto v = literalIntValue;    skip(); return Value::createInt64 (v); }
        if (matches (Token::literalFloat32))     { auto v = literalDoubleValue; skip(); return Value ((float) v); }
        if (matches (Token::literalFloat64))     { auto v = literalDoubleValue; skip(); return Value (v); }
        if (matches (Token::literalString))      { auto v = program.getStringDictionary().getHandleForString (currentStringValue); skip(); return Value::createStringLiteral(v); }
        if (matchIf ("true"))                    { return Value (true); }
        if (matchIf ("false"))                   { return Value (false); }
        if (matchIf (HEARTOperator::minus))      { return negate (parseAnnotationValue()); }
        if (matches (Token::variableIdentifier)) { location.throwError (Errors::propertyMustBeConstant()); }

        auto infOrNaN = parseNaNandInfinityTokens();

        if (infOrNaN.isValid())
            return infOrNaN;

        location.throwError (Errors::missingAnnotationValue());
    }